

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O2

Blob * jbcoin::generateRootDeterministicPublicKey(Blob *__return_storage_ptr__,uint128 *seed)

{
  bignum privKey;
  ec_point pubKey;
  bn_ctx ctx;
  bignum local_28;
  ec_point local_20;
  bn_ctx local_18;
  
  openssl::bn_ctx::bn_ctx(&local_18);
  generateRootDeterministicKey((jbcoin *)&local_28,seed);
  openssl::multiply((openssl *)&local_20,openssl::secp256k1curve,&local_28,&local_18);
  BN_clear((BIGNUM *)local_28.ptr);
  serialize_ec_point(__return_storage_ptr__,&local_20);
  openssl::ec_point::~ec_point(&local_20);
  openssl::bignum::~bignum(&local_28);
  openssl::bn_ctx::~bn_ctx(&local_18);
  return __return_storage_ptr__;
}

Assistant:

Blob generateRootDeterministicPublicKey (uint128 const& seed)
{
    bn_ctx ctx;

    bignum privKey = generateRootDeterministicKey (seed);

    // compute the corresponding public key point
    ec_point pubKey = multiply (secp256k1curve.group, privKey, ctx);

    privKey.clear();  // security erase

    return serialize_ec_point (pubKey);
}